

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O0

int __thiscall
axl::sys::NameableEventBase<axl::sl::True>::close(NameableEventBase<axl::sl::True> *this,int __fd)

{
  bool bVar1;
  
  if (this->m_event != (EventImpl *)0x0) {
    if (this->m_event == (EventImpl *)&this->field_3) {
      CondMutexEventBase<axl::sl::True>::~CondMutexEventBase
                ((CondMutexEventBase<axl::sl::True> *)0x12e649);
    }
    else {
      bVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty
                        (&(this->m_name).
                          super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      if (!bVar1) {
        io::psx::SharedMemory::unlink((char *)&this->m_name);
        CondMutexEventBase<axl::sl::True>::~CondMutexEventBase
                  ((CondMutexEventBase<axl::sl::True> *)0x12e678);
      }
    }
    io::psx::Mapping::close(&this->m_mapping,__fd);
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)this);
    this->m_event = (EventImpl *)0x0;
  }
  return (int)this;
}

Assistant:

void
	close() {
		if (!m_event)
			return;

		if (m_event == (EventImpl*)m_unnamedEventBuffer) {
			m_event->~EventImpl();
		} else if (!m_name.isEmpty()) {
			io::psx::SharedMemory::unlink(m_name);
			m_event->~EventImpl();
		}

		m_mapping.close();
		m_name.clear();
		m_event = NULL;
	}